

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VocabularyTest.cpp
# Opt level: O2

void __thiscall
vocabulary_test_index_check_Test::~vocabulary_test_index_check_Test
          (vocabulary_test_index_check_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this);
  return;
}

Assistant:

TEST(vocabulary_test, index_check) {
    vector<string> words;
    for (int i = 0; i < 10000; i++) {
        string word;
        for (int j = 0; j < 3; j++)
            word.push_back(char('a' + prng() % 26));
        words.push_back(word);
    }

    Vocabulary<string> vocab(words);
    Vocabulary<string> vocab2;
    vocab2.loads(vocab.dumps());
    unordered_set<uint32_t> indices;
    for (string word : vocab2) {
        uint32_t index = vocab2.get_index(word);
        ASSERT_TRUE(indices.count(index) == 0);
        indices.insert(index);
        ASSERT_TRUE(word == vocab2[index]);
    }
}